

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *from,
          VerySimpleReadOnlyString *to,bool includeFind)

{
  uint uVar1;
  tCharPtr pcVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  ulong extraout_RDX;
  uint uVar8;
  uint uVar9;
  int iVar10;
  char *__s;
  char in_R8B;
  uint uVar11;
  int iVar12;
  VerySimpleReadOnlyString VVar13;
  ulong uVar7;
  
  uVar1 = from->length;
  pcVar2 = from->data;
  iVar10 = 0;
  uVar8 = 0;
  do {
    uVar4 = uVar8;
    if (uVar8 < uVar1) {
      uVar4 = uVar1;
    }
    uVar7 = 0;
LAB_0010eb1a:
    iVar12 = (int)uVar7;
    uVar9 = uVar1;
    if (uVar4 + iVar10 == iVar12) goto LAB_0010eb43;
    if (to->data[uVar7] == pcVar2[uVar8 + iVar12]) break;
    uVar8 = uVar8 + 1;
    iVar10 = iVar10 + -1;
  } while( true );
  uVar7 = (ulong)(iVar12 + 1U);
  uVar9 = uVar8;
  if (to->length == iVar12 + 1U) {
LAB_0010eb43:
    uVar6 = to->length + uVar9;
    uVar7 = (ulong)uVar6;
    uVar8 = *(uint *)((long *)CONCAT71(in_register_00000009,includeFind) + 1);
    uVar4 = uVar6;
    goto LAB_0010eb4d;
  }
  goto LAB_0010eb1a;
LAB_0010eb4d:
  uVar11 = 0;
  while( true ) {
    uVar5 = uVar1;
    if (uVar1 <= uVar4 + uVar11) goto LAB_0010eb7a;
    if (*(char *)(*(long *)CONCAT71(in_register_00000009,includeFind) + (ulong)uVar11) !=
        pcVar2[uVar4 + uVar11]) break;
    uVar11 = uVar11 + 1;
    uVar5 = uVar4;
    if (uVar8 == uVar11) {
LAB_0010eb7a:
      uVar4 = uVar6;
      if (in_R8B != '\0') {
        uVar4 = uVar9;
      }
      __s = "";
      if (uVar9 <= uVar1 && uVar1 - uVar9 != 0) {
        __s = pcVar2 + uVar4;
      }
      if (uVar5 < uVar1) {
        if (in_R8B == '\0') {
          iVar10 = uVar5 - uVar6;
        }
        else {
          iVar10 = (uVar8 - uVar9) + uVar5;
        }
      }
      else {
        iVar10 = 0;
        if (in_R8B != '\0') {
          iVar10 = uVar1 - uVar9;
        }
      }
      this->data = __s;
      if (iVar10 == -1) {
        if (__s == (char *)0x0) {
          iVar10 = 0;
        }
        else {
          sVar3 = strlen(__s);
          iVar10 = (int)sVar3;
          uVar7 = extraout_RDX;
        }
      }
      this->length = iVar10;
      VVar13._8_8_ = uVar7;
      VVar13.data = (tCharPtr)this;
      return VVar13;
    }
  }
  uVar4 = uVar4 + 1;
  goto LAB_0010eb4d;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromTo(const VerySimpleReadOnlyString & from, const VerySimpleReadOnlyString & to, const bool includeFind) const
	{
	    const unsigned int fromPos = Find(from);
	    const unsigned int toPos = Find(to, fromPos + from.length);
	    return VerySimpleReadOnlyString(fromPos >= (unsigned int)length ? "" : &data[includeFind ? fromPos : fromPos + (unsigned int)from.length],
	                                    toPos < (unsigned int)length ? (includeFind ? toPos + (unsigned int)to.length - fromPos : toPos - fromPos - (unsigned int)from.length)
	                                       // If the "to" needle was not found, either we return the whole string (includeFind) or an empty string
	                                       : (includeFind ? (unsigned int)length - fromPos : 0));
	}